

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Namespace::Namespace
          (Namespace *this,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  CodeLocation local_38;
  Context *local_28;
  Context *processorName_local;
  CodeLocation *processorKeyword_local;
  Namespace *this_local;
  Identifier moduleName_local;
  
  local_28 = processorName;
  processorName_local = (Context *)processorKeyword;
  processorKeyword_local = (CodeLocation *)this;
  this_local = (Namespace *)moduleName.name;
  CodeLocation::CodeLocation(&local_38,processorKeyword);
  ModuleBase::ModuleBase
            (&this->super_ModuleBase,Namespace,&local_38,local_28,(Identifier)this_local);
  CodeLocation::~CodeLocation(&local_38);
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject = (_func_int **)&PTR__Namespace_0063aee8;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__Namespace_0063afc0;
  ImportsList::ImportsList(&this->importsList);
  std::
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ::vector(&this->functions);
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ::vector(&this->subModules);
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ::vector(&this->constants);
  std::
  vector<soul::AST::Namespace::NamespaceInstance,_std::allocator<soul::AST::Namespace::NamespaceInstance>_>
  ::vector(&this->namespaceInstances);
  return;
}

Assistant:

Namespace (CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ModuleBase (ObjectType::Namespace, processorKeyword, processorName, moduleName) {}